

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O3

uint64_t getHouseList(int *out,uint64_t seed,int chunkX,int chunkZ)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  lVar4 = (seed ^ 0x5deece66d) * 0x5deece66d + 0xb;
  uVar5 = lVar4 * 0x5deece66d + 0xb;
  lVar6 = (uVar5 & 0xffffffffffff) * 0x5deece66d + 0xb;
  uVar5 = ((long)chunkZ *
           ((lVar6 * 0x5deece66d0000 + 0xb0000 >> 0x20) +
           (ulong)((uint)lVar6 & 0xffff0000) * 0x10000) ^
           (long)chunkX * ((long)(int)(uVar5 >> 0x10) + (ulong)((uint)lVar4 & 0xffff0000) * 0x10000)
          ^ seed ^ 0x5deece66d) * 0x5deece66d + 0xb;
  do {
    uVar1 = uVar5 * 0x5deece66d + 0xb;
    uVar5 = uVar1 & 0xffffffffffff;
    iVar3 = (int)(uVar5 >> 0x11);
    iVar2 = iVar3 + (int)((uVar5 >> 0x11) / 3) * -3;
  } while (-1 < (iVar2 - iVar3) + -3);
  *out = iVar2 + 2;
  uVar5 = uVar1 * 0x5deece66d + 0xb;
  out[1] = (uint)(uVar5 >> 0x2f) & 1;
  do {
    uVar1 = uVar5 * 0x5deece66d + 0xb;
    uVar5 = uVar1 & 0xffffffffffff;
    iVar3 = (int)(uVar5 >> 0x11);
    iVar2 = iVar3 + (int)((uVar5 >> 0x11) / 3) * -3;
  } while (-1 < (iVar2 - iVar3) + -3);
  out[2] = iVar2;
  uVar5 = uVar1 * 0x5deece66d + 0xb;
  out[3] = ((uint)(uVar5 >> 0x2e) & 3) + 2;
  do {
    uVar1 = uVar5 * 0x5deece66d + 0xb;
    uVar5 = uVar1 & 0xffffffffffff;
    iVar3 = (int)(uVar5 >> 0x11);
    iVar2 = iVar3 + (int)((uVar5 >> 0x11) / 3) * -3;
  } while (-1 < (iVar2 - iVar3) + -3);
  out[4] = iVar2;
  uVar5 = uVar1 * 0x5deece66d + 0xb;
  out[5] = ((uint)(uVar5 >> 0x2e) & 3) + 1;
  do {
    uVar1 = uVar5 * 0x5deece66d + 0xb;
    uVar5 = uVar1 & 0xffffffffffff;
    iVar3 = (int)(uVar5 >> 0x11);
    iVar2 = iVar3 + (int)((uVar5 >> 0x11) / 3) * -3;
  } while (-1 < (iVar2 - iVar3) + -3);
  out[6] = iVar2 + 2;
  lVar4 = uVar1 * 0x5deece66d + 0xb;
  out[7] = (uint)((ulong)lVar4 >> 0x2f) & 1;
  uVar5 = lVar4 * 0x5deece66d + 0xb;
  out[8] = (uint)(uVar5 >> 0x2e) & 3;
  return uVar5 & 0xffffffffffff;
}

Assistant:

uint64_t getHouseList(int *out, uint64_t seed, int chunkX, int chunkZ)
{
    uint64_t rng = chunkGenerateRnd(seed, chunkX, chunkZ);
    skipNextN(&rng, 1);

    out[HouseSmall] = nextInt(&rng, 4 - 2 + 1) + 2;
    out[Church]     = nextInt(&rng, 1 - 0 + 1) + 0;
    out[Library]    = nextInt(&rng, 2 - 0 + 1) + 0;
    out[WoodHut]    = nextInt(&rng, 5 - 2 + 1) + 2;
    out[Butcher]    = nextInt(&rng, 2 - 0 + 1) + 0;
    out[FarmLarge]  = nextInt(&rng, 4 - 1 + 1) + 1;
    out[FarmSmall]  = nextInt(&rng, 4 - 2 + 1) + 2;
    out[Blacksmith] = nextInt(&rng, 1 - 0 + 1) + 0;
    out[HouseLarge] = nextInt(&rng, 3 - 0 + 1) + 0;

    return rng;
}